

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverselock_tests.cpp
# Opt level: O2

void __thiscall reverselock_tests::reverselock_multiple::test_method(reverselock_multiple *this)

{
  long lVar1;
  iterator pvVar2;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  check_type cVar4;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  assertion_result local_200;
  char **local_1e8;
  assertion_result local_1e0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  Mutex mutex;
  Mutex mutex2;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock2;
  reverse_lock revlock7;
  reverse_lock revlock6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mutex2.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  mutex2.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex2.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutex2.super_mutex.super___mutex_base._M_mutex.__align = 0;
  mutex2.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super_mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  mutex.super_mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super_mutex.super___mutex_base._M_mutex._8_8_ = 0;
  mutex.super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock2,&mutex2,"mutex2",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x1f,false);
  pvVar3 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&lock,&mutex,"mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x20,false);
  pvVar2 = (iterator)0x24;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (&revlock6,&lock,"lock",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x24);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_188;
  msg.m_end = pvVar3;
  msg.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_198,msg);
  local_200._0_8_ = CONCAT71(local_200._1_7_,lock.super_unique_lock._M_owns) ^ 1;
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  revlock7.lockname._M_dataplus._M_p = (pointer)&local_1e0;
  local_1e0._0_8_ = "!lock.owns_lock()";
  local_1e0.m_message.px = (element_type *)0xbd0f15;
  revlock7.templock.super_unique_lock._M_device =
       (mutex_type *)((ulong)revlock7.templock.super_unique_lock._M_device & 0xffffffffffffff00);
  revlock7.lock = (UniqueLock<AnnotatedMixin<std::mutex>_> *)&PTR__lazy_ostream_011481f0;
  revlock7.templock.super_unique_lock._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1a0 = "";
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&revlock7,1,0,WARN,_cVar4,(size_t)&local_1a8,0x25);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  pvVar2 = (iterator)0x26;
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::reverse_lock
            (&revlock7,&lock2,"lock2",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
             ,0x26);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x27;
  file_00.m_begin = (iterator)&local_1b8;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
             msg_00);
  local_1e0._0_8_ = CONCAT71(local_1e0._1_7_,lock2.super_unique_lock._M_owns) ^ 1;
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1e8 = &local_210;
  local_210 = "!lock2.owns_lock()";
  local_208 = "";
  local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
  local_200._0_8_ = &PTR__lazy_ostream_011481f0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_218 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,(lazy_ostream *)&local_200,1,0,WARN,_cVar4,(size_t)&local_220,0x27);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&revlock7);
  UniqueLock<AnnotatedMixin<std::mutex>_>::reverse_lock::~reverse_lock(&revlock6);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x29;
  file_01.m_begin = (iterator)&local_230;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_240,
             msg_01);
  revlock7.lock =
       (UniqueLock<AnnotatedMixin<std::mutex>_> *)
       CONCAT71(revlock7.lock._1_7_,lock.super_unique_lock._M_owns);
  revlock7.templock.super_unique_lock._M_device = (mutex_type *)0x0;
  revlock7.templock.super_unique_lock._M_owns = false;
  revlock7.templock.super_unique_lock._9_7_ = 0;
  local_200._0_8_ = "lock.owns_lock()";
  local_200.m_message.px = (element_type *)0xbd0f15;
  revlock6.templock.super_unique_lock._M_device._0_1_ = 0;
  revlock6.lock = (UniqueLock<AnnotatedMixin<std::mutex>_> *)&PTR__lazy_ostream_011481f0;
  revlock6.templock.super_unique_lock._8_8_ = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_248 = "";
  pvVar2 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  revlock6.lockname._M_dataplus._M_p = (pointer)&local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&revlock7,(lazy_ostream *)&revlock6,1,0,WARN,_cVar4,
             (size_t)&local_250,0x29);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&revlock7.templock.super_unique_lock._M_owns);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/reverselock_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_260;
  msg_02.m_end = pvVar3;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_270,
             msg_02);
  revlock7.lock =
       (UniqueLock<AnnotatedMixin<std::mutex>_> *)
       CONCAT71(revlock7.lock._1_7_,lock2.super_unique_lock._M_owns);
  revlock7.templock.super_unique_lock._M_device = (mutex_type *)0x0;
  revlock7.templock.super_unique_lock._M_owns = false;
  revlock7.templock.super_unique_lock._9_7_ = 0;
  local_200._0_8_ = "lock2.owns_lock()";
  local_200.m_message.px = (element_type *)0xbd0f4a;
  revlock6.templock.super_unique_lock._M_device._0_1_ = 0;
  revlock6.lock = (UniqueLock<AnnotatedMixin<std::mutex>_> *)&PTR__lazy_ostream_011481f0;
  revlock6.templock.super_unique_lock._8_8_ = boost::unit_test::lazy_ostream::inst;
  revlock6.lockname._M_dataplus._M_p = (pointer)&local_200;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&revlock7,(lazy_ostream *)&revlock6,1,0,WARN,0xbd0e8d,
             (size_t)&stack0xfffffffffffffd80,0x2a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&revlock7.templock.super_unique_lock._M_owns);
  std::unique_lock<std::mutex>::~unique_lock(&lock.super_unique_lock);
  std::unique_lock<std::mutex>::~unique_lock(&lock2.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(reverselock_multiple)
{
    Mutex mutex2;
    Mutex mutex;
    WAIT_LOCK(mutex2, lock2);
    WAIT_LOCK(mutex, lock);

    // Make sure undoing two locks succeeds
    {
        REVERSE_LOCK(lock);
        BOOST_CHECK(!lock.owns_lock());
        REVERSE_LOCK(lock2);
        BOOST_CHECK(!lock2.owns_lock());
    }
    BOOST_CHECK(lock.owns_lock());
    BOOST_CHECK(lock2.owns_lock());
}